

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined8 uVar3;
  FILE *__stream;
  size_t sVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar9;
  wasm_global_t *pwVar10;
  char *pcVar11;
  wasm_val_t val33;
  wasm_val_vec_t res;
  wasm_val_t val37;
  wasm_val_t val34;
  wasm_val_t val_12;
  wasm_val_t vs73 [1];
  wasm_val_vec_t args73;
  wasm_val_vec_t args_12;
  wasm_val_vec_t results_12;
  wasm_byte_vec_t binary;
  wasm_extern_vec_t exports;
  wasm_val_t vs78 [1];
  wasm_val_t vs77 [1];
  wasm_val_t vs74 [1];
  wasm_val_t val38;
  wasm_val_t val_i64_4;
  wasm_val_t val_f32_3;
  wasm_val_t val_i64_2;
  wasm_val_t val_f32_1;
  wasm_val_vec_t args78;
  wasm_val_vec_t args77;
  wasm_val_vec_t args74;
  wasm_extern_vec_t imports;
  wasm_extern_t *externs [4];
  undefined4 local_288;
  undefined4 uStack_284;
  float fStack_280;
  undefined4 uStack_27c;
  wasm_global_t *local_270;
  wasm_global_t *local_268;
  undefined8 local_260;
  undefined8 local_258;
  long lStack_250;
  undefined8 local_248;
  undefined1 *puStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined1 local_228 [8];
  float local_220;
  undefined4 uStack_21c;
  wasm_func_t *local_210;
  wasm_func_t *local_208;
  wasm_func_t *local_200;
  wasm_func_t *local_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 *local_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  wasm_func_t *local_1b0;
  wasm_func_t *local_1a8;
  wasm_func_t *local_1a0;
  wasm_func_t *local_198;
  wasm_func_t *local_190;
  wasm_func_t *local_188;
  wasm_func_t *local_180;
  wasm_func_t *local_178;
  wasm_global_t *local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined1 *local_140;
  undefined1 local_138 [8];
  void *local_130;
  wasm_extern_vec_t local_128;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined4 local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined8 local_98;
  undefined4 *local_90;
  undefined8 local_88;
  undefined4 *local_80;
  undefined8 local_78;
  undefined4 *local_70;
  undefined8 local_68;
  undefined8 *local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  
  pcVar11 = "Initializing...";
  puts("Initializing...");
  iVar2 = printf(pcVar11);
  uVar3 = wasm_store_new(CONCAT44(extraout_var,iVar2));
  puts("Loading binary...");
  __stream = fopen("global.wasm","rb");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    sVar4 = ftell(__stream);
    fseek(__stream,0,0);
    wasm_byte_vec_new_uninitialized(local_138,sVar4);
    sVar4 = fread(local_130,sVar4,1,__stream);
    if (sVar4 == 1) {
      fclose(__stream);
      puts("Compiling module...");
      local_268 = (wasm_global_t *)wasm_module_new(uVar3,local_138);
      if (local_268 != (wasm_global_t *)0x0) {
        local_160 = CONCAT44(extraout_var,iVar2);
        wasm_byte_vec_delete(local_138);
        puts("Creating globals...");
        uVar5 = wasm_valtype_new(2);
        uVar6 = wasm_globaltype_new(uVar5,0);
        uVar5 = wasm_valtype_new(1);
        uVar5 = wasm_globaltype_new(uVar5,0);
        local_270 = (wasm_global_t *)uVar5;
        uVar7 = wasm_valtype_new(2);
        uVar7 = wasm_globaltype_new(uVar7,1);
        uVar8 = wasm_valtype_new(1);
        local_260 = wasm_globaltype_new(uVar8,1);
        local_a8 = 2;
        uStack_a4 = 0;
        uStack_a0 = 0x3f800000;
        uStack_9c = 0;
        local_1f0 = wasm_global_new(uVar3,uVar6);
        local_b8 = 1;
        uStack_b4 = 0;
        uStack_b0 = 2;
        uStack_ac = 0;
        local_150 = wasm_global_new(uVar3,uVar5);
        local_c8 = 2;
        uStack_c4 = 0;
        uStack_c0 = 0x40400000;
        uStack_bc = 0;
        local_158 = wasm_global_new(uVar3,uVar7);
        uVar5 = local_260;
        local_d8 = 1;
        uStack_d4 = 0;
        uStack_d0 = 4;
        uStack_cc = 0;
        uVar8 = wasm_global_new(uVar3,local_260);
        wasm_globaltype_delete(uVar6);
        wasm_globaltype_delete(local_270);
        wasm_globaltype_delete(uVar7);
        uVar7 = local_150;
        uVar6 = local_158;
        wasm_globaltype_delete(uVar5);
        puts("Instantiating module...");
        local_58 = wasm_global_as_extern(local_1f0);
        local_50 = wasm_global_as_extern(uVar7);
        local_48 = wasm_global_as_extern(uVar6);
        local_260 = uVar8;
        local_40 = wasm_global_as_extern(uVar8);
        pwVar10 = local_268;
        local_68 = 4;
        local_168 = uVar3;
        local_60 = &local_58;
        lVar9 = wasm_instance_new(uVar3,local_268,&local_68,0);
        if (lVar9 == 0) {
          puts("> Error instantiating module!");
          return 1;
        }
        wasm_module_delete(pwVar10);
        puts("Extracting exports...");
        wasm_instance_exports(lVar9);
        pwVar10 = get_export_global(&local_128,0);
        local_170 = get_export_global(&local_128,1);
        local_268 = get_export_global(&local_128,2);
        local_270 = get_export_global(&local_128,3);
        local_178 = get_export_func(&local_128,4);
        local_180 = get_export_func(&local_128,5);
        local_1f8 = get_export_func(&local_128,6);
        local_200 = get_export_func(&local_128,7);
        local_188 = get_export_func(&local_128,8);
        local_190 = get_export_func(&local_128,9);
        local_208 = get_export_func(&local_128,10);
        local_210 = get_export_func(&local_128,0xb);
        local_1b0 = get_export_func(&local_128,0xc);
        local_1a8 = get_export_func(&local_128,0xd);
        local_1a0 = get_export_func(&local_128,0xe);
        local_198 = get_export_func(&local_128,0xf);
        uVar3 = wasm_global_copy(uVar6);
        cVar1 = wasm_global_same(uVar6,uVar3);
        if (cVar1 != '\0') {
          wasm_global_delete(uVar3);
          puts("Accessing globals...");
          wasm_global_get(local_1f0,&local_288);
          if (((fStack_280 == 1.0) && (!NAN(fStack_280))) &&
             (wasm_global_get(uVar7,&local_288), CONCAT44(uStack_27c,fStack_280) == 2)) {
            wasm_global_get(uVar6,&local_288);
            if (((fStack_280 == 3.0) && (!NAN(fStack_280))) &&
               (wasm_global_get(local_260,&local_288), CONCAT44(uStack_27c,fStack_280) == 4)) {
              wasm_global_get(pwVar10,&local_288);
              if (((fStack_280 == 5.0) && (!NAN(fStack_280))) &&
                 (wasm_global_get(local_170,&local_288), uVar3 = local_260,
                 CONCAT44(uStack_27c,fStack_280) == 6)) {
                wasm_global_get(local_268,&local_288);
                if (((fStack_280 == 7.0) && (!NAN(fStack_280))) &&
                   (wasm_global_get(local_270,&local_288), CONCAT44(uStack_27c,fStack_280) == 8)) {
                  local_238 = 0;
                  uStack_230 = 0;
                  local_248 = 1;
                  puStack_240 = (undefined1 *)&local_288;
                  wasm_func_call(local_178);
                  if ((fStack_280 == 1.0) && (!NAN(fStack_280))) {
                    local_238 = 0;
                    uStack_230 = 0;
                    local_248 = 1;
                    puStack_240 = (undefined1 *)&local_288;
                    wasm_func_call(local_180);
                    if (CONCAT44(uStack_27c,fStack_280) == 2) {
                      local_238 = 0;
                      uStack_230 = 0;
                      local_248 = 1;
                      puStack_240 = (undefined1 *)&local_288;
                      wasm_func_call(local_1f8);
                      if ((fStack_280 == 3.0) && (!NAN(fStack_280))) {
                        local_238 = 0;
                        uStack_230 = 0;
                        local_248 = 1;
                        puStack_240 = (undefined1 *)&local_288;
                        wasm_func_call(local_200);
                        if (CONCAT44(uStack_27c,fStack_280) == 4) {
                          local_238 = 0;
                          uStack_230 = 0;
                          local_248 = 1;
                          puStack_240 = (undefined1 *)&local_288;
                          wasm_func_call(local_188);
                          if ((fStack_280 == 5.0) && (!NAN(fStack_280))) {
                            local_238 = 0;
                            uStack_230 = 0;
                            local_248 = 1;
                            puStack_240 = (undefined1 *)&local_288;
                            wasm_func_call(local_190);
                            if (CONCAT44(uStack_27c,fStack_280) == 6) {
                              local_238 = 0;
                              uStack_230 = 0;
                              local_248 = 1;
                              puStack_240 = (undefined1 *)&local_288;
                              wasm_func_call(local_208);
                              if ((fStack_280 == 7.0) && (!NAN(fStack_280))) {
                                local_238 = 0;
                                uStack_230 = 0;
                                local_248 = 1;
                                puStack_240 = (undefined1 *)&local_288;
                                wasm_func_call(local_210);
                                if (CONCAT44(uStack_27c,fStack_280) == 8) {
                                  local_288 = 2;
                                  uStack_284 = 0;
                                  fStack_280 = 33.0;
                                  uStack_27c = 0;
                                  wasm_global_set(uVar6);
                                  local_238 = 1;
                                  uStack_230 = 0x22;
                                  wasm_global_set(uVar3);
                                  local_248 = 2;
                                  puStack_240 = (undefined1 *)0x42140000;
                                  wasm_global_set(local_268);
                                  local_e8 = 1;
                                  uStack_e4 = 0;
                                  uStack_e0 = 0x26;
                                  uStack_dc = 0;
                                  wasm_global_set(local_270);
                                  wasm_global_get(uVar6,&local_258);
                                  if ((((float)lStack_250 == 33.0) && (!NAN((float)lStack_250))) &&
                                     (wasm_global_get(uVar3,&local_258), lStack_250 == 0x22)) {
                                    wasm_global_get(local_268,&local_258);
                                    if (((float)lStack_250 == 37.0) && (!NAN((float)lStack_250))) {
                                      wasm_global_get(local_270,&local_258);
                                      if (lStack_250 == 0x26) {
                                        local_1e8 = 0;
                                        uStack_1e0 = 0;
                                        local_1d8 = 1;
                                        local_1d0 = &local_258;
                                        wasm_func_call(local_1f8);
                                        if (((float)lStack_250 == 33.0) && (!NAN((float)lStack_250))
                                           ) {
                                          local_1e8 = 0;
                                          uStack_1e0 = 0;
                                          local_1d8 = 1;
                                          local_1d0 = &local_258;
                                          wasm_func_call(local_200);
                                          if (lStack_250 == 0x22) {
                                            local_1e8 = 0;
                                            uStack_1e0 = 0;
                                            local_1d8 = 1;
                                            local_1d0 = &local_258;
                                            wasm_func_call(local_208);
                                            if (((float)lStack_250 == 37.0) &&
                                               (!NAN((float)lStack_250))) {
                                              local_1e8 = 0;
                                              uStack_1e0 = 0;
                                              local_1d8 = 1;
                                              local_1d0 = &local_258;
                                              wasm_func_call(local_210,&local_1e8);
                                              if (lStack_250 == 0x26) {
                                                local_258 = 0;
                                                lStack_250 = 0;
                                                local_1e8 = 2;
                                                uStack_1e0 = 0x42920000;
                                                local_1d8 = 1;
                                                local_1d0 = &local_1e8;
                                                wasm_func_call(local_1b0,&local_1d8,&local_258);
                                                local_70 = &local_f8;
                                                local_f8 = 1;
                                                uStack_f4 = 0;
                                                uStack_f0 = 0x4a;
                                                uStack_ec = 0;
                                                local_78 = 1;
                                                wasm_func_call(local_1a8,&local_78,&local_258);
                                                local_80 = &local_108;
                                                local_108 = 2;
                                                uStack_104 = 0;
                                                uStack_100 = 0x429a0000;
                                                uStack_fc = 0;
                                                local_88 = 1;
                                                wasm_func_call(local_1a0,&local_88,&local_258);
                                                local_90 = &local_118;
                                                local_118 = 1;
                                                uStack_114 = 0;
                                                uStack_110 = 0x4e;
                                                uStack_10c = 0;
                                                local_98 = 1;
                                                wasm_func_call(local_198,&local_98,&local_258);
                                                wasm_global_get(uVar6,local_228);
                                                if (((local_220 == 73.0) && (!NAN(local_220))) &&
                                                   (wasm_global_get(local_260,local_228),
                                                   CONCAT44(uStack_21c,local_220) == 0x4a)) {
                                                  wasm_global_get(local_268,local_228);
                                                  if ((local_220 == 77.0) && (!NAN(local_220))) {
                                                    wasm_global_get(local_270,local_228);
                                                    uVar3 = local_260;
                                                    if (CONCAT44(uStack_21c,local_220) == 0x4e) {
                                                      local_1c8 = 0;
                                                      uStack_1c0 = 0;
                                                      local_148 = 1;
                                                      local_140 = local_228;
                                                      wasm_func_call(local_1f8);
                                                      if ((local_220 == 73.0) && (!NAN(local_220)))
                                                      {
                                                        local_1c8 = 0;
                                                        uStack_1c0 = 0;
                                                        local_148 = 1;
                                                        local_140 = local_228;
                                                        wasm_func_call(local_200);
                                                        if (CONCAT44(uStack_21c,local_220) == 0x4a)
                                                        {
                                                          local_1c8 = 0;
                                                          uStack_1c0 = 0;
                                                          local_148 = 1;
                                                          local_140 = local_228;
                                                          wasm_func_call(local_208);
                                                          if ((local_220 == 77.0) &&
                                                             (!NAN(local_220))) {
                                                            local_1c8 = 0;
                                                            uStack_1c0 = 0;
                                                            local_148 = 1;
                                                            local_140 = local_228;
                                                            wasm_func_call(local_210);
                                                            if (CONCAT44(uStack_21c,local_220) ==
                                                                0x4e) {
                                                              wasm_global_delete(local_1f0);
                                                              wasm_global_delete(uVar7);
                                                              wasm_global_delete(uVar6);
                                                              wasm_global_delete(uVar3);
                                                              wasm_extern_vec_delete(&local_128);
                                                              wasm_instance_delete(lVar9);
                                                              puts("Shutting down...");
                                                              wasm_store_delete(local_168);
                                                              wasm_engine_delete(local_160);
                                                              puts("Done.");
                                                              return 0;
                                                            }
                                                          }
                                                        }
                                                      }
                                                    }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          puts("> Error reading value");
          exit(1);
        }
        __assert_fail("wasm_global_same(var_f32_import, copy)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/third_party/wasm-c-api/example/global.c"
                      ,0x9b,"int main(int, const char **)");
      }
      pcVar11 = "> Error compiling module!";
      goto LAB_00101ffd;
    }
  }
  pcVar11 = "> Error loading module!";
LAB_00101ffd:
  puts(pcVar11);
  return 1;
}

Assistant:

int main(int argc, const char* argv[]) {
  // Initialize.
  printf("Initializing...\n");
  wasm_engine_t* engine = wasm_engine_new();
  wasm_store_t* store = wasm_store_new(engine);

  // Load binary.
  printf("Loading binary...\n");
  FILE* file = fopen("global.wasm", "rb");
  if (!file) {
    printf("> Error loading module!\n");
    return 1;
  }
  fseek(file, 0L, SEEK_END);
  size_t file_size = ftell(file);
  fseek(file, 0L, SEEK_SET);
  wasm_byte_vec_t binary;
  wasm_byte_vec_new_uninitialized(&binary, file_size);
  if (fread(binary.data, file_size, 1, file) != 1) {
    printf("> Error loading module!\n");
    return 1;
  }
  fclose(file);

  // Compile.
  printf("Compiling module...\n");
  own wasm_module_t* module = wasm_module_new(store, &binary);
  if (!module) {
    printf("> Error compiling module!\n");
    return 1;
  }

  wasm_byte_vec_delete(&binary);

  // Create external globals.
  printf("Creating globals...\n");
  own wasm_globaltype_t* const_f32_type = wasm_globaltype_new(
    wasm_valtype_new(WASM_F32), WASM_CONST);
  own wasm_globaltype_t* const_i64_type = wasm_globaltype_new(
    wasm_valtype_new(WASM_I64), WASM_CONST);
  own wasm_globaltype_t* var_f32_type = wasm_globaltype_new(
    wasm_valtype_new(WASM_F32), WASM_VAR);
  own wasm_globaltype_t* var_i64_type = wasm_globaltype_new(
    wasm_valtype_new(WASM_I64), WASM_VAR);

  wasm_val_t val_f32_1 = WASM_F32_VAL(1);
  own wasm_global_t* const_f32_import =
    wasm_global_new(store, const_f32_type, &val_f32_1);
  wasm_val_t val_i64_2 = WASM_I64_VAL(2);
  own wasm_global_t* const_i64_import =
    wasm_global_new(store, const_i64_type, &val_i64_2);
  wasm_val_t val_f32_3 = WASM_F32_VAL(3);
  own wasm_global_t* var_f32_import =
    wasm_global_new(store, var_f32_type, &val_f32_3);
  wasm_val_t val_i64_4 = WASM_I64_VAL(4);
  own wasm_global_t* var_i64_import =
    wasm_global_new(store, var_i64_type, &val_i64_4);

  wasm_globaltype_delete(const_f32_type);
  wasm_globaltype_delete(const_i64_type);
  wasm_globaltype_delete(var_f32_type);
  wasm_globaltype_delete(var_i64_type);

  // Instantiate.
  printf("Instantiating module...\n");
  wasm_extern_t* externs[] = {
    wasm_global_as_extern(const_f32_import),
    wasm_global_as_extern(const_i64_import),
    wasm_global_as_extern(var_f32_import),
    wasm_global_as_extern(var_i64_import)
  };
  wasm_extern_vec_t imports = WASM_ARRAY_VEC(externs);
  own wasm_instance_t* instance =
    wasm_instance_new(store, module, &imports, NULL);
  if (!instance) {
    printf("> Error instantiating module!\n");
    return 1;
  }

  wasm_module_delete(module);

  // Extract export.
  printf("Extracting exports...\n");
  own wasm_extern_vec_t exports;
  wasm_instance_exports(instance, &exports);
  size_t i = 0;
  wasm_global_t* const_f32_export = get_export_global(&exports, i++);
  wasm_global_t* const_i64_export = get_export_global(&exports, i++);
  wasm_global_t* var_f32_export = get_export_global(&exports, i++);
  wasm_global_t* var_i64_export = get_export_global(&exports, i++);
  wasm_func_t* get_const_f32_import = get_export_func(&exports, i++);
  wasm_func_t* get_const_i64_import = get_export_func(&exports, i++);
  wasm_func_t* get_var_f32_import = get_export_func(&exports, i++);
  wasm_func_t* get_var_i64_import = get_export_func(&exports, i++);
  wasm_func_t* get_const_f32_export = get_export_func(&exports, i++);
  wasm_func_t* get_const_i64_export = get_export_func(&exports, i++);
  wasm_func_t* get_var_f32_export = get_export_func(&exports, i++);
  wasm_func_t* get_var_i64_export = get_export_func(&exports, i++);
  wasm_func_t* set_var_f32_import = get_export_func(&exports, i++);
  wasm_func_t* set_var_i64_import = get_export_func(&exports, i++);
  wasm_func_t* set_var_f32_export = get_export_func(&exports, i++);
  wasm_func_t* set_var_i64_export = get_export_func(&exports, i++);

  // Try cloning.
  own wasm_global_t* copy = wasm_global_copy(var_f32_import);
  assert(wasm_global_same(var_f32_import, copy));
  wasm_global_delete(copy);

  // Interact.
  printf("Accessing globals...\n");

  // Check initial values.
  check_global(const_f32_import, f32, 1);
  check_global(const_i64_import, i64, 2);
  check_global(var_f32_import, f32, 3);
  check_global(var_i64_import, i64, 4);
  check_global(const_f32_export, f32, 5);
  check_global(const_i64_export, i64, 6);
  check_global(var_f32_export, f32, 7);
  check_global(var_i64_export, i64, 8);

  check_call(get_const_f32_import, f32, 1);
  check_call(get_const_i64_import, i64, 2);
  check_call(get_var_f32_import, f32, 3);
  check_call(get_var_i64_import, i64, 4);
  check_call(get_const_f32_export, f32, 5);
  check_call(get_const_i64_export, i64, 6);
  check_call(get_var_f32_export, f32, 7);
  check_call(get_var_i64_export, i64, 8);

  // Modify variables through API and check again.
  wasm_val_t val33 = WASM_F32_VAL(33);
  wasm_global_set(var_f32_import, &val33);
  wasm_val_t val34 = WASM_I64_VAL(34);
  wasm_global_set(var_i64_import, &val34);
  wasm_val_t val37 = WASM_F32_VAL(37);
  wasm_global_set(var_f32_export, &val37);
  wasm_val_t val38 = WASM_I64_VAL(38);
  wasm_global_set(var_i64_export, &val38);

  check_global(var_f32_import, f32, 33);
  check_global(var_i64_import, i64, 34);
  check_global(var_f32_export, f32, 37);
  check_global(var_i64_export, i64, 38);

  check_call(get_var_f32_import, f32, 33);
  check_call(get_var_i64_import, i64, 34);
  check_call(get_var_f32_export, f32, 37);
  check_call(get_var_i64_export, i64, 38);

  // Modify variables through calls and check again.
  wasm_val_vec_t res = WASM_EMPTY_VEC;
  wasm_val_t vs73[] = { WASM_F32_VAL(73) };
  wasm_val_vec_t args73 = WASM_ARRAY_VEC(vs73);
  wasm_func_call(set_var_f32_import, &args73, &res);
  wasm_val_t vs74[] = { WASM_I64_VAL(74) };
  wasm_val_vec_t args74 = WASM_ARRAY_VEC(vs74);
  wasm_func_call(set_var_i64_import, &args74, &res);
  wasm_val_t vs77[] = { WASM_F32_VAL(77) };
  wasm_val_vec_t args77 = WASM_ARRAY_VEC(vs77);
  wasm_func_call(set_var_f32_export, &args77, &res);
  wasm_val_t vs78[] = { WASM_I64_VAL(78) };
  wasm_val_vec_t args78 = WASM_ARRAY_VEC(vs78);
  wasm_func_call(set_var_i64_export, &args78, &res);

  check_global(var_f32_import, f32, 73);
  check_global(var_i64_import, i64, 74);
  check_global(var_f32_export, f32, 77);
  check_global(var_i64_export, i64, 78);

  check_call(get_var_f32_import, f32, 73);
  check_call(get_var_i64_import, i64, 74);
  check_call(get_var_f32_export, f32, 77);
  check_call(get_var_i64_export, i64, 78);

  wasm_global_delete(const_f32_import);
  wasm_global_delete(const_i64_import);
  wasm_global_delete(var_f32_import);
  wasm_global_delete(var_i64_import);
  wasm_extern_vec_delete(&exports);
  wasm_instance_delete(instance);

  // Shut down.
  printf("Shutting down...\n");
  wasm_store_delete(store);
  wasm_engine_delete(engine);

  // All done.
  printf("Done.\n");
  return 0;
}